

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureLayerCase::test
          (AttachmentTextureLayerCase *this)

{
  CallLogWrapper *testCtx;
  int layer;
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  GLuint textureID_1;
  GLuint textureID;
  GLuint framebufferID;
  
  framebufferID = 0;
  testCtx = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(testCtx,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(testCtx,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(testCtx,1,&textureID);
  glu::CallLogWrapper::glBindTexture(testCtx,0x806f,textureID);
  glu::CallLogWrapper::glTexStorage3D(testCtx,0x806f,1,0x8058,0x10,0x10,0x10);
  for (GVar1 = 0; GVar1 != 0x10; GVar1 = GVar1 + 1) {
    GVar2 = 0;
    GVar3 = GVar1;
    glu::CallLogWrapper::glFramebufferTextureLayer(testCtx,0x8d40,0x8ce0,textureID,0,GVar1);
    checkColorAttachmentParam
              ((anon_unknown_1 *)
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (TestContext *)testCtx,(CallLogWrapper *)0x8cd4,GVar1,GVar2,GVar3);
  }
  glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(testCtx,1,&textureID);
  textureID_1 = 0;
  glu::CallLogWrapper::glGenTextures(testCtx,1,&textureID_1);
  glu::CallLogWrapper::glBindTexture(testCtx,0x8c1a,textureID_1);
  glu::CallLogWrapper::glTexStorage3D(testCtx,0x8c1a,1,0x8058,0x10,0x10,0x10);
  for (GVar1 = 0; GVar1 != 0x10; GVar1 = GVar1 + 1) {
    GVar2 = 0;
    GVar3 = GVar1;
    glu::CallLogWrapper::glFramebufferTextureLayer(testCtx,0x8d40,0x8ce0,textureID_1,0,GVar1);
    checkColorAttachmentParam
              ((anon_unknown_1 *)
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (TestContext *)testCtx,(CallLogWrapper *)0x8cd4,GVar1,GVar2,GVar3);
  }
  glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(testCtx,1,&textureID_1);
  glu::CallLogWrapper::glDeleteFramebuffers(testCtx,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// tex3d
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_3D, textureID);
			glTexStorage3D(GL_TEXTURE_3D, 1, GL_RGBA8, 16, 16, 16);

			for (int layer = 0; layer < 16; ++layer)
			{
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureID, 0, layer);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER, layer);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}
		// tex2d array
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D_ARRAY, textureID);
			glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 16, 16, 16);

			for (int layer = 0; layer < 16; ++layer)
			{
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureID, 0, layer);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER, layer);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}